

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonMaximumSuppression.pb.cc
# Opt level: O0

size_t __thiscall
CoreML::Specification::NonMaximumSuppression::ByteSizeLong(NonMaximumSuppression *this)

{
  bool bVar1;
  SuppressionMethodCase SVar2;
  ClassLabelsCase CVar3;
  int size;
  ulong uVar4;
  string *psVar5;
  size_t sVar6;
  long lVar7;
  double dVar8;
  int cached_size;
  uint64_t raw_confidencethreshold;
  double tmp_confidencethreshold;
  uint64_t raw_iouthreshold;
  double tmp_iouthreshold;
  size_t sStack_18;
  uint32_t cached_has_bits;
  size_t total_size;
  NonMaximumSuppression *this_local;
  
  sStack_18 = 0;
  _internal_confidenceinputfeaturename_abi_cxx11_(this);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    psVar5 = _internal_confidenceinputfeaturename_abi_cxx11_(this);
    sStack_18 = google::protobuf::internal::WireFormatLite::StringSize(psVar5);
    sStack_18 = sStack_18 + 2;
  }
  _internal_coordinatesinputfeaturename_abi_cxx11_(this);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    psVar5 = _internal_coordinatesinputfeaturename_abi_cxx11_(this);
    sVar6 = google::protobuf::internal::WireFormatLite::StringSize(psVar5);
    sStack_18 = sVar6 + 2 + sStack_18;
  }
  _internal_iouthresholdinputfeaturename_abi_cxx11_(this);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    psVar5 = _internal_iouthresholdinputfeaturename_abi_cxx11_(this);
    sVar6 = google::protobuf::internal::WireFormatLite::StringSize(psVar5);
    sStack_18 = sVar6 + 2 + sStack_18;
  }
  _internal_confidencethresholdinputfeaturename_abi_cxx11_(this);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    psVar5 = _internal_confidencethresholdinputfeaturename_abi_cxx11_(this);
    sVar6 = google::protobuf::internal::WireFormatLite::StringSize(psVar5);
    sStack_18 = sVar6 + 2 + sStack_18;
  }
  _internal_confidenceoutputfeaturename_abi_cxx11_(this);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    psVar5 = _internal_confidenceoutputfeaturename_abi_cxx11_(this);
    sVar6 = google::protobuf::internal::WireFormatLite::StringSize(psVar5);
    sStack_18 = sVar6 + 2 + sStack_18;
  }
  _internal_coordinatesoutputfeaturename_abi_cxx11_(this);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    psVar5 = _internal_coordinatesoutputfeaturename_abi_cxx11_(this);
    sVar6 = google::protobuf::internal::WireFormatLite::StringSize(psVar5);
    sStack_18 = sVar6 + 2 + sStack_18;
  }
  dVar8 = _internal_iouthreshold(this);
  if (dVar8 != 0.0) {
    sStack_18 = sStack_18 + 10;
  }
  dVar8 = _internal_confidencethreshold(this);
  if (dVar8 != 0.0) {
    sStack_18 = sStack_18 + 10;
  }
  SVar2 = SuppressionMethod_case(this);
  if ((SVar2 != SUPPRESSIONMETHOD_NOT_SET) && (SVar2 == kPickTop)) {
    sVar6 = google::protobuf::internal::WireFormatLite::
            MessageSize<CoreML::Specification::NonMaximumSuppression_PickTop>
                      ((this->SuppressionMethod_).picktop_);
    sStack_18 = sVar6 + 1 + sStack_18;
  }
  CVar3 = ClassLabels_case(this);
  if (CVar3 != CLASSLABELS_NOT_SET) {
    if (CVar3 == kStringClassLabels) {
      sVar6 = google::protobuf::internal::WireFormatLite::
              MessageSize<CoreML::Specification::StringVector>
                        ((this->ClassLabels_).stringclasslabels_);
      sStack_18 = sVar6 + 2 + sStack_18;
    }
    else if (CVar3 == kInt64ClassLabels) {
      sVar6 = google::protobuf::internal::WireFormatLite::
              MessageSize<CoreML::Specification::Int64Vector>
                        ((this->ClassLabels_).int64classlabels_);
      sStack_18 = sVar6 + 2 + sStack_18;
    }
  }
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_MessageLite)._internal_metadata_);
  if (bVar1) {
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    lVar7 = std::__cxx11::string::size();
    sStack_18 = lVar7 + sStack_18;
  }
  size = google::protobuf::internal::ToCachedSize(sStack_18);
  SetCachedSize(this,size);
  return sStack_18;
}

Assistant:

size_t NonMaximumSuppression::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.NonMaximumSuppression)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // string confidenceInputFeatureName = 200;
  if (!this->_internal_confidenceinputfeaturename().empty()) {
    total_size += 2 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_confidenceinputfeaturename());
  }

  // string coordinatesInputFeatureName = 201;
  if (!this->_internal_coordinatesinputfeaturename().empty()) {
    total_size += 2 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_coordinatesinputfeaturename());
  }

  // string iouThresholdInputFeatureName = 202;
  if (!this->_internal_iouthresholdinputfeaturename().empty()) {
    total_size += 2 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_iouthresholdinputfeaturename());
  }

  // string confidenceThresholdInputFeatureName = 203;
  if (!this->_internal_confidencethresholdinputfeaturename().empty()) {
    total_size += 2 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_confidencethresholdinputfeaturename());
  }

  // string confidenceOutputFeatureName = 210;
  if (!this->_internal_confidenceoutputfeaturename().empty()) {
    total_size += 2 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_confidenceoutputfeaturename());
  }

  // string coordinatesOutputFeatureName = 211;
  if (!this->_internal_coordinatesoutputfeaturename().empty()) {
    total_size += 2 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_coordinatesoutputfeaturename());
  }

  // double iouThreshold = 110;
  static_assert(sizeof(uint64_t) == sizeof(double), "Code assumes uint64_t and double are the same size.");
  double tmp_iouthreshold = this->_internal_iouthreshold();
  uint64_t raw_iouthreshold;
  memcpy(&raw_iouthreshold, &tmp_iouthreshold, sizeof(tmp_iouthreshold));
  if (raw_iouthreshold != 0) {
    total_size += 2 + 8;
  }

  // double confidenceThreshold = 111;
  static_assert(sizeof(uint64_t) == sizeof(double), "Code assumes uint64_t and double are the same size.");
  double tmp_confidencethreshold = this->_internal_confidencethreshold();
  uint64_t raw_confidencethreshold;
  memcpy(&raw_confidencethreshold, &tmp_confidencethreshold, sizeof(tmp_confidencethreshold));
  if (raw_confidencethreshold != 0) {
    total_size += 2 + 8;
  }

  switch (SuppressionMethod_case()) {
    // .CoreML.Specification.NonMaximumSuppression.PickTop pickTop = 1;
    case kPickTop: {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *SuppressionMethod_.picktop_);
      break;
    }
    case SUPPRESSIONMETHOD_NOT_SET: {
      break;
    }
  }
  switch (ClassLabels_case()) {
    // .CoreML.Specification.StringVector stringClassLabels = 100;
    case kStringClassLabels: {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *ClassLabels_.stringclasslabels_);
      break;
    }
    // .CoreML.Specification.Int64Vector int64ClassLabels = 101;
    case kInt64ClassLabels: {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *ClassLabels_.int64classlabels_);
      break;
    }
    case CLASSLABELS_NOT_SET: {
      break;
    }
  }
  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}